

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O3

void __thiscall PlayerA::PlayerA(PlayerA *this)

{
  INT32 IVar1;
  
  (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_smplBuf).
  super__Vector_base<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_smplBuf).
  super__Vector_base<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_smplBuf).
  super__Vector_base<_waveform_32bit_stereo,_std::allocator<_waveform_32bit_stereo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_config).masterVol = 0x10000;
  (this->_config).ignoreVolGain = false;
  (this->_config).chnInvert = '\0';
  (this->_config).loopCount = 2;
  (this->_config).fadeSmpls = 0;
  (this->_config).endSilenceSmpls = 0;
  (this->_config).pbSpeed = 1.0;
  this->_outSmplBits = '\x10';
  this->_outSmplPack = SampleConv_toS16;
  this->_smplRate = 0xac44;
  this->_outSmplSize1 = 2;
  this->_outSmplSizeA = 4;
  this->_plrCbFunc = (PLAYER_EVENT_CB)0x0;
  this->_plrCbParam = (void *)0x0;
  this->_myPlayState = '\0';
  this->_outSmplChns = '\x02';
  this->_player = (PlayerBase *)0x0;
  this->_dLoad = (DATA_LOADER *)0x0;
  IVar1 = CalcSongVolume(this);
  this->_songVolume = IVar1;
  this->_fadeSmplStart = 0xffffffff;
  this->_endSilenceStart = 0xffffffff;
  return;
}

Assistant:

PlayerA::PlayerA()
{
	_config.masterVol = 0x10000;	// fixed point 16.16
	_config.ignoreVolGain = false;
	_config.chnInvert = 0x00;
	_config.loopCount = 2;
	_config.fadeSmpls = 0;
	_config.endSilenceSmpls = 0;
	_config.pbSpeed = 1.0;
	
	_outSmplChns = 2;
	_outSmplBits = 16;
	_outSmplPack = GetSampleConvFunc(_outSmplBits);
	_smplRate = 44100;
	_outSmplSize1 = _outSmplBits / 8;
	_outSmplSizeA = _outSmplSize1 * _outSmplChns;
	
	_plrCbFunc = NULL;
	_plrCbParam = NULL;
	_myPlayState = 0x00;
	_player = NULL;
	_dLoad = NULL;
	_songVolume = CalcSongVolume();
	_fadeSmplStart = (UINT32)-1;
	_endSilenceStart = (UINT32)-1;
	
	return;
}